

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O3

bool __thiscall embree::XML::hasChild(XML *this,string *childID)

{
  pointer pRVar1;
  pointer __s2;
  size_t __n;
  XML *pXVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  pRVar1 = (this->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->children).
                super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1;
  if (lVar4 == 0) {
    bVar7 = false;
  }
  else {
    uVar5 = lVar4 >> 3;
    __s2 = (childID->_M_dataplus)._M_p;
    __n = childID->_M_string_length;
    bVar7 = true;
    uVar6 = 1;
    do {
      pXVar2 = pRVar1[uVar6 - 1].ptr;
      if ((pXVar2->name)._M_string_length == __n) {
        if (__n == 0) {
          return bVar7;
        }
        iVar3 = bcmp((pXVar2->name)._M_dataplus._M_p,__s2,__n);
        if (iVar3 == 0) {
          return bVar7;
        }
      }
      bVar7 = uVar6 < uVar5;
      lVar4 = uVar6 + (-(ulong)(uVar5 == 0) - uVar5);
      uVar6 = uVar6 + 1;
    } while (lVar4 != 0);
  }
  return bVar7;
}

Assistant:

bool hasChild(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return true;
      return false;
    }